

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O3

int main(void)

{
  tester_t *ptVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  __pid_t _Var6;
  tester_t *ptVar7;
  ssize_t sVar8;
  _Bool *p_Var9;
  char *pcVar10;
  automaton *paVar11;
  tester_list *ptVar12;
  undefined1 local_45c [8];
  validator_mq_msg validator_msg;
  char parent_pid_str [12];
  int local_38;
  int local_34;
  
  main_pid = getpid();
  p_Var9 = &err;
  children = pid_list_create(&err);
  if (err == true) {
    main_cold_12();
    paVar11 = (automaton *)p_Var9;
LAB_00102139:
    main_cold_11();
LAB_0010213e:
    main_cold_10();
  }
  else {
    iVar4 = sigemptyset((sigset_t *)&err_action.sa_mask);
    if (iVar4 == -1) {
LAB_001019cf:
      err = true;
      pcVar10 = "Fail in %s, function: %s";
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                    ,"setup_sig_handlers");
    }
    else {
      err_action.sa_flags = 0;
      err_action.__sigaction_handler.sa_handler = sig_err_handler;
      iVar4 = sigaction(2,(sigaction *)&err_action,(sigaction *)0x0);
      if (((iVar4 == -1) ||
          (iVar4 = sigaction(0xf,(sigaction *)&err_action,(sigaction *)0x0), iVar4 == -1)) ||
         (iVar4 = sigemptyset((sigset_t *)&snt_success_action.sa_mask), iVar4 == -1))
      goto LAB_001019cf;
      snt_success_action.sa_flags = 0x10000000;
      snt_success_action.__sigaction_handler.sa_handler = sig_snt_success_handler;
      iVar4 = __libc_current_sigrtmin();
      pcVar10 = (char *)(ulong)(iVar4 + 1U);
      iVar4 = sigaction(iVar4 + 1U,(sigaction *)&snt_success_action,(sigaction *)0x0);
      if (iVar4 == -1) goto LAB_001019cf;
    }
    paVar11 = (automaton *)pcVar10;
    if (err == true) goto LAB_00102139;
    p_Var9 = &err;
    tester_data = tester_list_create(&err);
    paVar11 = (automaton *)p_Var9;
    if (err == true) goto LAB_0010213e;
    paVar11 = &a;
    load_automaton(&a,&err);
    if (err != true) {
      paVar11 = (automaton *)0x1;
      validator_mq = validator_mq_start(true,&err);
      if (err != true) {
        if (halt_flag_raised == '\0') {
          do {
            validator_mq_receive(validator_mq,(validator_mq_msg *)local_45c,&err);
            if (err == true) {
              main_cold_1();
            }
            ptVar7 = tester_for_request((validator_mq_msg *)local_45c);
            uVar5 = getpid();
            log_formatted("%d RCD: %s, completed=%d, finish=%d, for TESTER IN LIST: %d, bal=%d, completed=%d, expected_rcd=%d"
                          ,(ulong)uVar5,&validator_msg.accepted,(ulong)local_45c[2],
                          (ulong)(byte)local_45c[3],(ulong)(uint)ptVar7->pid,
                          (ulong)(uint)ptVar7->word_bal,(ulong)ptVar7->completed,ptVar7->rcd);
            if ((_Bool)local_45c[0] == true) {
              comm_summary.rcd = comm_summary.rcd + 1;
              ptVar7->rcd = ptVar7->rcd + 1;
              ptVar7->word_bal = ptVar7->word_bal + 1;
              ptVar7->completed = (_Bool)local_45c[2];
              local_45c[0] = false;
              local_45c[3] = true;
              local_45c[4] = false;
              iVar4 = pipe(&local_38);
              if ((err == false) && (iVar4 != -1)) {
                _Var6 = fork();
                if (_Var6 == -1) {
                  err = true;
                }
                else {
                  if (_Var6 == 0) {
                    validator_mq_finish(false,validator_mq,&err);
                    if (err == true) {
                      kill(main_pid,0xf);
                    }
                    iVar4 = close(0);
                    if ((((iVar4 == 0) && (iVar4 = dup(local_38), iVar4 == 0)) &&
                        (iVar4 = close(local_38), iVar4 == 0)) &&
                       (iVar4 = close(local_34), iVar4 == 0)) {
                      sprintf(validator_msg.word + 0x3e4,"%d",(ulong)(uint)main_pid);
                      parent_pid_str._4_8_ = (long)"./run" + 2;
                      execvp("./run",(char **)(parent_pid_str + 4));
                    }
                    exit(1);
                  }
                  await_forks = await_forks + 1;
                  await_runs = await_runs + 1;
                  pid_list_emplace(children,_Var6,&err);
                }
                iVar4 = close(local_38);
                if ((err == false) && (iVar4 != -1)) {
                  _Var6 = fork();
                  if (_Var6 == -1) {
                    err = true;
                  }
                  else {
                    if (_Var6 == 0) {
                      validator_mq_finish(false,validator_mq,&err);
                      if (err == true) {
                        kill(main_pid,0xf);
                      }
                      sVar8 = write(local_34,&a,0x40c88);
                      if (sVar8 != 0x40c88) {
                        kill(main_pid,0xf);
                      }
                      sVar8 = write(local_34,local_45c,0x3f8);
                      if (sVar8 != 0x3f8) {
                        kill(main_pid,0xf);
                      }
                      iVar4 = close(local_34);
                      if (iVar4 == -1) {
                        kill(main_pid,0xf);
                      }
                      exit(0);
                    }
                    await_forks = await_forks + 1;
                    pid_list_emplace(children,_Var6,&err);
                  }
                  iVar4 = close(local_34);
                  if ((err == false) && (iVar4 != -1)) goto LAB_00101f23;
                  goto LAB_00101edd;
                }
                err = true;
                close(local_34);
                bVar2 = err & 1;
joined_r0x00101f21:
                if (bVar2 == 0) goto LAB_00101f23;
              }
              else {
LAB_00101edd:
                err = true;
              }
LAB_00101eeb:
              main_cold_3();
            }
            else if ((_Bool)local_45c[1] == true) {
              halt_flag_raised = '\x01';
              ptVar7->completed = true;
              for (ptVar12 = tester_data->next; ptVar12 != (tester_list *)0x0;
                  ptVar12 = ptVar12->next) {
                ptVar1 = ptVar12->this;
                if ((ptVar1->word_bal == 0) && (ptVar1->completed_sent == false)) {
                  ptVar7->completed_sent = true;
                  async_send_to_tester(ptVar1->pid,(char *)0x0,true,ptVar1->rcd,true,false);
                  if (err == true) {
                    main_cold_2();
                  }
                }
              }
            }
            else {
              if ((_Bool)local_45c[3] == true) {
                await_runs = await_runs - 1;
                iVar4 = ptVar7->word_bal + -1;
                ptVar7->word_bal = iVar4;
                if ((_Bool)local_45c[4] == true) {
                  comm_summary.acc = comm_summary.acc + 1;
                  ptVar7->acc = ptVar7->acc + 1;
                }
                if (((iVar4 == 0 & ptVar7->completed) == 1) && (ptVar7->completed_sent == false)) {
                  ptVar7->completed_sent = true;
                  _Var3 = true;
                }
                else {
                  _Var3 = false;
                }
                async_send_to_tester
                          (ptVar7->pid,&validator_msg.accepted,_Var3,ptVar7->rcd,false,
                           (_Bool)local_45c[4]);
                bVar2 = err;
                goto joined_r0x00101f21;
              }
              ptVar7->completed = (_Bool)local_45c[2];
              if ((((_Bool)local_45c[2] == true) && (ptVar7->word_bal == 0)) &&
                 (ptVar7->completed_sent == false)) {
                ptVar7->completed_sent = true;
                _Var3 = true;
              }
              else {
                _Var3 = false;
              }
              async_send_to_tester
                        (ptVar7->pid,(char *)0x0,_Var3,ptVar7->rcd,true,(_Bool)local_45c[4]);
              if (err == true) goto LAB_00101eeb;
            }
LAB_00101f23:
          } while (halt_flag_raised == '\0');
        }
        if (await_runs != 0) {
          p_Var9 = &validator_msg.accepted;
          do {
            validator_mq_receive(validator_mq,(validator_mq_msg *)local_45c,&err);
            if (err == true) {
              main_cold_4();
            }
            ptVar7 = tester_for_request((validator_mq_msg *)local_45c);
            uVar5 = getpid();
            log_formatted("%d RCD: %s, completed=%d, finish=%d, for TESTER IN LIST: %d, bal=%d, completed=%d, expected_rcd=%d"
                          ,(ulong)uVar5,p_Var9,(ulong)local_45c[2],(ulong)(byte)local_45c[3],
                          (ulong)(uint)ptVar7->pid,(ulong)(uint)ptVar7->word_bal,
                          (ulong)ptVar7->completed,ptVar7->rcd);
            if ((_Bool)local_45c[3] == true) {
              await_runs = await_runs - 1;
              iVar4 = ptVar7->word_bal + -1;
              ptVar7->word_bal = iVar4;
              if ((_Bool)local_45c[4] == true) {
                comm_summary.acc = comm_summary.acc + 1;
                ptVar7->acc = ptVar7->acc + 1;
              }
              async_send_to_tester
                        (ptVar7->pid,p_Var9,iVar4 == 0,ptVar7->rcd,false,(_Bool)local_45c[4]);
              if (err != false) {
LAB_00101bac:
                main_cold_5();
              }
            }
            else {
              if ((ptVar7->word_bal == 0) && (ptVar7->completed_sent == false)) {
                ptVar7->completed_sent = true;
                _Var3 = true;
              }
              else {
                _Var3 = false;
              }
              async_send_to_tester(ptVar7->pid,p_Var9,_Var3,ptVar7->rcd,true,false);
              if (err == true) goto LAB_00101bac;
            }
          } while (await_runs != 0);
        }
        if (await_forks != 0) {
          do {
            parent_pid_str._4_8_ = parent_pid_str._4_8_ & 0xffffffff00000000;
            _Var6 = wait(parent_pid_str + 4);
            if ((_Var6 == -1) || (parent_pid_str._4_4_ != 0)) {
              err = true;
              log_formatted("Fail in %s, function: %s",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                            ,"collect_forks");
              break;
            }
            await_forks = await_forks - 1;
          } while (await_forks != 0);
        }
        if (err == true) {
          main_cold_6();
        }
        validator_mq_finish(true,validator_mq,&err);
        if (err == true) {
          main_cold_7();
        }
        print_comm_summary(&comm_summary,true);
        tester_list_print_log(tester_data);
        tester_list_destroy(tester_data);
        pid_list_destroy(children);
        return 0;
      }
      goto LAB_00102148;
    }
  }
  main_cold_9();
LAB_00102148:
  main_cold_8();
  ptVar7 = tester_list_find(tester_data,(pid_t)paVar11->states_size);
  if ((ptVar7 == (tester_t *)0x0) &&
     (ptVar7 = tester_list_emplace(tester_data,(pid_t)paVar11->states_size,0,0,0,false,false,&err),
     err == true)) {
    tester_for_request_cold_1();
  }
  return (int)ptVar7;
}

Assistant:

int main() {
    assert(err == false);
    // initial setup
    main_pid = getpid();
    children = pid_list_create(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to create list of children pids");
    setup_sig_handlers(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to set up signal handlers");
    tester_data = tester_list_create(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to create tester list");
    load_automaton(&a, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to load automaton");

    // setup queues
    validator_mq = validator_mq_start(true, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to start validator MQ");

    // handle incoming requests
    validator_mq_msg validator_msg;
    while(!halt_flag_raised) {
        validator_mq_receive(validator_mq, &validator_msg, &err);
        HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to receive message from validator mq");

        tester_t *tester = tester_for_request(&validator_msg);
        handle_request_standard(tester, &validator_msg);
    }
    // after halt flag is raised, wait for runs to complete and ignore other testers if necessary
    while(await_runs) {
        validator_mq_receive(validator_mq, &validator_msg, &err);
        HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to receive message from validator mq");

        tester_t *tester = tester_for_request(&validator_msg);
        handle_request_only_finish(tester, &validator_msg);
    }
    // clean up
    collect_forks(&err);
    HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to collect forks created for async tasks");

    validator_mq_finish(true, validator_mq, &err);
    HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to close validator MQ");

    print_comm_summary(&comm_summary, true);
    tester_list_print_log(tester_data);
    tester_list_destroy(tester_data);
    pid_list_destroy(children);
    return 0;
}